

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiredis.c
# Opt level: O1

int redisGetReply(redisContext *c,void **reply)

{
  int iVar1;
  int iVar2;
  int wdone;
  void *aux;
  int local_2c;
  void *local_28;
  
  local_2c = 0;
  local_28 = (void *)0x0;
  iVar1 = redisGetReplyFromReader(c,&local_28);
  iVar2 = -1;
  if (iVar1 != -1) {
    if ((local_28 == (void *)0x0) && ((c->flags & 1) != 0)) {
      do {
        iVar2 = redisBufferWrite(c,&local_2c);
        if (iVar2 == -1) {
          return -1;
        }
      } while (local_2c == 0);
      do {
        iVar2 = redisBufferRead(c);
        if (iVar2 == -1) {
          return -1;
        }
        iVar2 = redisGetReplyFromReader(c,&local_28);
        if (iVar2 == -1) {
          return -1;
        }
      } while (local_28 == (void *)0x0);
    }
    iVar2 = 0;
    if (reply != (void **)0x0) {
      *reply = local_28;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int redisGetReply(redisContext *c, void **reply) {
    int wdone = 0;
    void *aux = NULL;

    /* Try to read pending replies */
    if (redisGetReplyFromReader(c,&aux) == REDIS_ERR)
        return REDIS_ERR;

    /* For the blocking context, flush output buffer and read reply */
    if (aux == NULL && c->flags & REDIS_BLOCK) {
        /* Write until done */
        do {
            if (redisBufferWrite(c,&wdone) == REDIS_ERR)
                return REDIS_ERR;
        } while (!wdone);

        /* Read until there is a reply */
        do {
            if (redisBufferRead(c) == REDIS_ERR)
                return REDIS_ERR;
            if (redisGetReplyFromReader(c,&aux) == REDIS_ERR)
                return REDIS_ERR;
        } while (aux == NULL);
    }

    /* Set reply object */
    if (reply != NULL) *reply = aux;
    return REDIS_OK;
}